

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult *
Catch::clara::detail::invokeLambda<int,Catch::makeCommandLineParser(Catch::ConfigData&)::__2>
          (anon_class_8_1_50637480_for_m_lambda *lambda,string *arg)

{
  bool bVar1;
  int *in_RDX;
  string *in_RSI;
  BasicResult<Catch::clara::detail::ParseResultType> *in_RDI;
  long in_FS_OFFSET;
  int temp;
  ParserResult result;
  BasicResult<Catch::clara::detail::ParseResultType> *in_stack_ffffffffffffff80;
  BasicResult<Catch::clara::detail::ParseResultType> *this;
  anon_class_8_1_50637480_for_m_lambda *in_stack_ffffffffffffff98;
  BasicResult local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  convertInto<int>(in_RSI,in_RDX);
  bVar1 = BasicResult::operator_cast_to_bool(local_38);
  if (bVar1) {
    LambdaInvoker<void>::invoke<Catch::makeCommandLineParser(Catch::ConfigData&)::__2,int>
              (in_stack_ffffffffffffff98,(int *)this);
  }
  else {
    BasicResult<Catch::clara::detail::ParseResultType>::BasicResult(this,in_RDI);
  }
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline auto invokeLambda( L const &lambda, std::string const &arg ) -> ParserResult {
        ArgType temp{};
        auto result = convertInto( arg, temp );
        return !result
           ? result
           : LambdaInvoker<typename UnaryLambdaTraits<L>::ReturnType>::invoke( lambda, temp );
    }